

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Console.cpp
# Opt level: O2

void __thiscall Console::Prompt::Private::Private(Private *this)

{
  tcflag_t *ptVar1;
  usize *puVar2;
  Item *pIVar3;
  code *pcVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  tcflag_t tVar7;
  tcflag_t tVar8;
  tcflag_t tVar9;
  speed_t sVar10;
  speed_t sVar11;
  cc_t cVar12;
  cc_t cVar13;
  cc_t cVar14;
  cc_t cVar15;
  cc_t cVar16;
  cc_t cVar17;
  cc_t cVar18;
  bool bVar19;
  int iVar20;
  usize uVar21;
  int stderrPipes [2];
  int stdoutPipes [2];
  String local_c8;
  String local_a0;
  String local_78;
  String local_50;
  
  this->valid = false;
  (this->bufferedInput).buffer = (byte *)0x0;
  puVar2 = &(this->bufferedInput)._capacity;
  (this->bufferedInput).bufferStart = (byte *)puVar2;
  (this->bufferedInput).bufferEnd = (byte *)puVar2;
  puVar2 = &(this->bufferedOutput)._capacity;
  *(undefined1 (*) [16])&(this->bufferedInput)._capacity = (undefined1  [16])0x0;
  (this->bufferedOutput).bufferStart = (byte *)puVar2;
  (this->bufferedOutput).bufferEnd = (byte *)puVar2;
  (this->bufferedOutput)._capacity = 0;
  pIVar3 = &(this->history).endItem;
  (this->prompt)._begin = (uint *)0x0;
  (this->prompt)._end = (uint *)0x0;
  *(undefined1 (*) [16])&(this->prompt)._capacity = (undefined1  [16])0x0;
  (this->input)._end = (uint *)0x0;
  (this->input)._capacity = 0;
  (this->history)._end.item = pIVar3;
  (this->history)._begin.item = pIVar3;
  (this->history)._size = 0;
  (this->history).endItem.value.data = &String::emptyData.super_Data;
  (this->historyPos).item = (Item *)0x0;
  (this->history).endItem.prev = (Item *)0x0;
  (this->history).endItem.next = (Item *)0x0;
  (this->history).freeItem = (Item *)0x0;
  (this->history).blocks = (ItemBlock *)0x0;
  if (originalStdout != -1) {
    return;
  }
  iVar20 = isatty(0);
  if (iVar20 == 0) {
    return;
  }
  this->valid = true;
  originalStdout = eventfd(0,0x80000);
  iVar20 = eventfd(0,0x80000);
  this->originalStderr = iVar20;
  iVar20 = dup3(1,originalStdout,0x80000);
  if (((((iVar20 != -1) ||
        (iVar20 = Debug::printf("%s:%u: verification failed: %s\n",
                                "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/src/Console.cpp"
                                ,0xc3), iVar20 == 0)) &&
       ((iVar20 = dup3(2,this->originalStderr,0x80000), iVar20 != -1 ||
        (iVar20 = Debug::printf("%s:%u: verification failed: %s\n",
                                "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/src/Console.cpp"
                                ,0xc4), iVar20 == 0)))) &&
      ((iVar20 = pipe2(stdoutPipes,0x80000), iVar20 == 0 ||
       (iVar20 = Debug::printf("%s:%u: verification failed: %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/src/Console.cpp"
                               ,199), iVar20 == 0)))) &&
     ((iVar20 = pipe2(stderrPipes,0x80000), iVar20 == 0 ||
      (iVar20 = Debug::printf("%s:%u: verification failed: %s\n",
                              "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/src/Console.cpp"
                              ,200), iVar20 == 0)))) {
    this->stdoutRead = stdoutPipes[0];
    this->stdoutWrite = stdoutPipes[1];
    this->stderrRead = stderrPipes[0];
    this->stderrWrite = stderrPipes[1];
    iVar20 = dup2(stdoutPipes[1],1);
    if (((((iVar20 != -1) ||
          (iVar20 = Debug::printf("%s:%u: verification failed: %s\n",
                                  "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/src/Console.cpp"
                                  ,0xcd), iVar20 == 0)) &&
         ((iVar20 = dup2(this->stderrWrite,2), iVar20 != -1 ||
          (iVar20 = Debug::printf("%s:%u: verification failed: %s\n",
                                  "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/src/Console.cpp"
                                  ,0xce), iVar20 == 0)))) &&
        ((iVar20 = setvbuf(_stdout,(char *)0x0,2,0), iVar20 == 0 ||
         (iVar20 = Debug::printf("%s:%u: verification failed: %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/src/Console.cpp"
                                 ,0xcf), iVar20 == 0)))) &&
       ((iVar20 = setvbuf(_stderr,(char *)0x0,2,0), iVar20 == 0 ||
        (iVar20 = Debug::printf("%s:%u: verification failed: %s\n",
                                "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/src/Console.cpp"
                                ,0xd0,"setvbuf(stderr, NULL, _IONBF, 0) == 0"), iVar20 == 0)))) {
      if (originalTermiosValid != false) {
LAB_00107656:
        if (resizeEventFd == 0) {
          resizeEventFd = eventfd(0,0x80000);
          signal(0x1c,handleWinch);
        }
        local_a0.data = &local_a0._data;
        local_a0._data.ref = 0;
        local_a0._data.str = "LANG";
        local_a0._data.len = 4;
        local_50.data = &String::emptyData.super_Data;
        Process::getEnvironmentVariable(&local_78,&local_a0,&local_50);
        local_c8.data = &local_c8._data;
        local_c8._data.ref = 0;
        local_c8._data.str = ".UTF-8";
        local_c8._data.len = 6;
        bVar19 = String::endsWith(&local_78,&local_c8);
        this->utf8 = bVar19;
        String::~String(&local_c8);
        String::~String(&local_78);
        String::~String(&local_50);
        String::~String(&local_a0);
        uVar21 = getScreenWidth(this);
        this->stdoutScreenWidth = uVar21;
        return;
      }
      iVar20 = tcgetattr(originalStdout,(termios *)&originalTermios);
      if ((iVar20 == 0) ||
         (iVar20 = Debug::printf("%s:%u: verification failed: %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/src/Console.cpp"
                                 ,0xd5,"tcgetattr(originalStdout, &originalTermios) == 0"),
         iVar20 == 0)) {
        originalTermiosValid = true;
        atexit(restoreTermMode);
        uVar5 = originalTermios._8_8_;
        tVar7 = originalTermios.c_oflag;
        (this->rawMode).c_iflag = originalTermios.c_iflag;
        uVar6 = originalTermios._8_8_;
        (this->rawMode).c_oflag = tVar7;
        originalTermios.c_cflag = (tcflag_t)uVar5;
        originalTermios.c_lflag = SUB84(uVar5,4);
        tVar7 = originalTermios.c_lflag;
        (this->rawMode).c_cflag = originalTermios.c_cflag;
        originalTermios._8_8_ = uVar6;
        uVar5 = originalTermios.c_cc._7_8_;
        (this->rawMode).c_lflag = tVar7;
        cVar12 = originalTermios.c_cc[0];
        cVar13 = originalTermios.c_cc[1];
        cVar14 = originalTermios.c_cc[2];
        cVar15 = originalTermios.c_cc[3];
        cVar16 = originalTermios.c_cc[4];
        cVar17 = originalTermios.c_cc[5];
        cVar18 = originalTermios.c_cc[6];
        (this->rawMode).c_line = originalTermios.c_line;
        (this->rawMode).c_cc[0] = cVar12;
        (this->rawMode).c_cc[1] = cVar13;
        (this->rawMode).c_cc[2] = cVar14;
        (this->rawMode).c_cc[3] = cVar15;
        (this->rawMode).c_cc[4] = cVar16;
        (this->rawMode).c_cc[5] = cVar17;
        (this->rawMode).c_cc[6] = cVar18;
        *(undefined8 *)((this->rawMode).c_cc + 7) = uVar5;
        uVar5 = CONCAT44(originalTermios.c_cc._27_4_,originalTermios.c_cc._23_4_);
        *(undefined8 *)((this->rawMode).c_cc + 0xf) = originalTermios.c_cc._15_8_;
        *(undefined8 *)((this->rawMode).c_cc + 0x17) = uVar5;
        uVar5 = originalTermios._52_8_;
        *(ulong *)((this->rawMode).c_cc + 0x1b) =
             CONCAT44(originalTermios._48_4_,originalTermios.c_cc._27_4_);
        uVar6 = originalTermios._52_8_;
        originalTermios.c_ispeed = (speed_t)uVar5;
        originalTermios.c_ospeed = SUB84(uVar5,4);
        sVar10 = originalTermios.c_ospeed;
        (this->rawMode).c_ispeed = originalTermios.c_ispeed;
        originalTermios._52_8_ = uVar6;
        (this->rawMode).c_ospeed = sVar10;
        cfmakeraw((termios *)&this->rawMode);
        ptVar1 = &(this->rawMode).c_lflag;
        *(byte *)ptVar1 = (byte)*ptVar1 | 1;
        (this->rawMode).c_cc[5] = '\0';
        (this->rawMode).c_cc[6] = '\x01';
        ptVar1 = &(this->rawMode).c_oflag;
        *(byte *)ptVar1 = (byte)*ptVar1 | 1;
        tVar7 = (this->rawMode).c_oflag;
        tVar8 = (this->rawMode).c_cflag;
        tVar9 = (this->rawMode).c_lflag;
        (this->noEchoMode).c_iflag = (this->rawMode).c_iflag;
        (this->noEchoMode).c_oflag = tVar7;
        (this->noEchoMode).c_cflag = tVar8;
        (this->noEchoMode).c_lflag = tVar9;
        uVar5 = *(undefined8 *)((this->rawMode).c_cc + 0x17);
        uVar6 = *(undefined8 *)((this->rawMode).c_cc + 0x1b);
        sVar10 = (this->rawMode).c_ispeed;
        sVar11 = (this->rawMode).c_ospeed;
        *(undefined8 *)((this->noEchoMode).c_cc + 0xf) = *(undefined8 *)((this->rawMode).c_cc + 0xf)
        ;
        *(undefined8 *)((this->noEchoMode).c_cc + 0x17) = uVar5;
        *(undefined8 *)((this->noEchoMode).c_cc + 0x1b) = uVar6;
        (this->noEchoMode).c_ispeed = sVar10;
        (this->noEchoMode).c_ospeed = sVar11;
        cVar12 = (this->rawMode).c_cc[0];
        cVar13 = (this->rawMode).c_cc[1];
        cVar14 = (this->rawMode).c_cc[2];
        (this->noEchoMode).c_line = (this->rawMode).c_line;
        (this->noEchoMode).c_cc[0] = cVar12;
        (this->noEchoMode).c_cc[1] = cVar13;
        (this->noEchoMode).c_cc[2] = cVar14;
        *(undefined2 *)((this->noEchoMode).c_cc + 3) = *(undefined2 *)((this->rawMode).c_cc + 3);
        *(undefined2 *)((this->noEchoMode).c_cc + 5) = *(undefined2 *)((this->rawMode).c_cc + 5);
        *(undefined8 *)((this->noEchoMode).c_cc + 7) = *(undefined8 *)((this->rawMode).c_cc + 7);
        ptVar1 = &(this->noEchoMode).c_oflag;
        *(byte *)ptVar1 = (byte)*ptVar1 | 1;
        iVar20 = tcsetattr(originalStdout,1,(termios *)&this->noEchoMode);
        if ((iVar20 == 0) ||
           (iVar20 = Debug::printf("%s:%u: verification failed: %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/src/Console.cpp"
                                   ,0xe4,"tcsetattr(originalStdout, TCSADRAIN, &noEchoMode) == 0"),
           iVar20 == 0)) goto LAB_00107656;
      }
    }
  }
  pcVar4 = (code *)invalidInstructionException();
  (*pcVar4)();
}

Assistant:

Private() : valid(false)
  {
#ifdef _MSC_VER
    if(!GetConsoleMode(GetStdHandle(STD_OUTPUT_HANDLE), &consoleOutputMode) ||
       !GetConsoleMode(GetStdHandle(STD_INPUT_HANDLE), &consoleInputMode))
      return; // no tty?
    valid = true;

    // redirect stdout and stderr to pipe
    VERIFY(CreatePipeEx(&hStdOutRead, &hStdOutWrite, NULL, 0, FILE_FLAG_OVERLAPPED, 0));
    VERIFY(CreatePipeEx(&hStdErrRead, &hStdErrWrite, NULL, 0, FILE_FLAG_OVERLAPPED, 0));
    originalStdout = _dup(_fileno(stdout));
    originalStderr = _dup(_fileno(stderr));
    newStdout = _open_osfhandle((intptr_t)hStdOutWrite, _O_BINARY);
    ASSERT(newStdout != -1);
    newStderr = _open_osfhandle((intptr_t)hStdErrWrite, _O_BINARY);
    VERIFY(_dup2(newStdout, _fileno(stdout)) == 0);
    VERIFY(_dup2(newStderr, _fileno(stderr)) == 0);
    VERIFY(setvbuf(stdout, NULL, _IONBF, 0) == 0);
    VERIFY(setvbuf(stderr, NULL, _IONBF, 0) == 0);
    SetStdHandle(STD_OUTPUT_HANDLE, (HANDLE)_get_osfhandle(_fileno(stdout)));
    SetStdHandle(STD_ERROR_HANDLE, (HANDLE)_get_osfhandle(_fileno(stderr)));
    hOriginalStdOut = (HANDLE)_get_osfhandle(originalStdout);
    ASSERT(hOriginalStdOut != INVALID_HANDLE_VALUE);
    hOriginalStdErr = (HANDLE)_get_osfhandle(originalStderr);
    ASSERT(hOriginalStdErr != INVALID_HANDLE_VALUE);

    // initialize overlapped reading of hStdOutRead
    ZeroMemory(&outOverlapped, sizeof(outOverlapped));
    ZeroMemory(&errOverlapped, sizeof(errOverlapped));
    VERIFY(outOverlapped.hEvent = CreateEvent(NULL, TRUE, TRUE, NULL));
    VERIFY(errOverlapped.hEvent = CreateEvent(NULL, TRUE, TRUE, NULL));
    DWORD read;
    while(ReadFile(hStdOutRead, stdoutBuffer, sizeof(stdoutBuffer), &read, &outOverlapped))
    {
      DWORD written;
      VERIFY(WriteConsole(hOriginalStdOut, stdoutBuffer, read / sizeof(char), &written, NULL));
      ASSERT(written == read / sizeof(char));
    }
    while(ReadFile(hStdErrRead, stderrBuffer, sizeof(stderrBuffer), &read, &errOverlapped))
    {
      DWORD written;
      VERIFY(WriteFile(hOriginalStdErr, stderrBuffer, read / sizeof(char), &written, NULL));
      ASSERT(written == read / sizeof(char));
    }

    // enable window events
    VERIFY(SetConsoleMode(GetStdHandle(STD_INPUT_HANDLE), consoleInputMode | ENABLE_WINDOW_INPUT));
#else
    if(originalStdout != -1)
      return; // you should not create more than a single instance of this class
    if(!isatty(STDIN_FILENO))
      return;
    valid = true;

#ifdef __CYGWIN__
    originalStdout = open("/dev/null", O_CLOEXEC);
    originalStderr = open("/dev/null", O_CLOEXEC);
#else
    originalStdout = eventfd(0, EFD_CLOEXEC); // create new file descriptor with O_CLOEXEC.. is there a better way to do this?
    originalStderr = eventfd(0, EFD_CLOEXEC); // create new file descriptor with O_CLOEXEC.. is there a better way to do this?
#endif
    VERIFY(dup3(STDOUT_FILENO, originalStdout, O_CLOEXEC) != -1); // create copy of STDOUT_FILENO
    VERIFY(dup3(STDERR_FILENO, originalStderr, O_CLOEXEC) != -1); // create copy of STDERR_FILENO
    int stdoutPipes[2];
    int stderrPipes[2];
    VERIFY(pipe2(stdoutPipes, O_CLOEXEC) == 0);
    VERIFY(pipe2(stderrPipes, O_CLOEXEC) == 0);
    stdoutRead = stdoutPipes[0];
    stdoutWrite = stdoutPipes[1];
    stderrRead = stderrPipes[0];
    stderrWrite = stderrPipes[1];
    VERIFY(dup2(stdoutWrite, STDOUT_FILENO) != -1);
    VERIFY(dup2(stderrWrite, STDERR_FILENO) != -1);
    VERIFY(setvbuf(stdout, NULL, _IONBF, 0) == 0);
    VERIFY(setvbuf(stderr, NULL, _IONBF, 0) == 0);

    // save term mode
    if(!originalTermiosValid)
    {
      VERIFY(tcgetattr(originalStdout, &originalTermios) == 0);
      originalTermiosValid = true;
      atexit(restoreTermMode);

      // get raw mode
      rawMode = originalTermios;
      cfmakeraw(&rawMode);
      rawMode.c_lflag |= ISIG;
      rawMode.c_cc[VMIN] = 1;
      rawMode.c_cc[VTIME] = 0;
      rawMode.c_oflag |= OPOST; // workaround for cygwin, TCSADRAIN does not seem to work reliably

      // disable input character echo
      noEchoMode = rawMode;
      noEchoMode.c_oflag |= OPOST;
      VERIFY(tcsetattr(originalStdout, TCSADRAIN, &noEchoMode) == 0);
    }

    // install console window resize signal handler
    if(!resizeEventFd)
    {
#ifdef __CYGWIN__
      int pipefd[2];
      VERIFY(pipe2(pipefd, O_CLOEXEC) == 0);
      resizeEventFd = pipefd[0];
      resizeEventFdWrite = pipefd[1];
#else
      resizeEventFd = eventfd(0, EFD_CLOEXEC);
#endif
      signal(SIGWINCH, handleWinch);
    }

    // utf8 console?
    utf8 = Process::getEnvironmentVariable("LANG").endsWith(".UTF-8"); // todo: endsWithNoCase?
#endif

    // get screen width
    stdoutScreenWidth = getScreenWidth();
  }